

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O1

void test_array_basic(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  int32_t iVar3;
  size_t sVar4;
  VALUE *pVVar5;
  uint uVar6;
  uint uVar7;
  VALUE a;
  VALUE local_40;
  
  uVar6 = 0;
  iVar1 = value_init_array((VALUE *)0x0);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x26b,"%s","value_init_array(NULL) != 0");
  sVar4 = value_array_size((VALUE *)0x0);
  acutest_check_((uint)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x26c,"%s","value_array_size(NULL) == 0");
  pVVar5 = value_array_get((VALUE *)0x0,0);
  acutest_check_((uint)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x26d,"%s","value_array_get(NULL, 0) == NULL");
  pVVar5 = value_array_get_all((VALUE *)0x0);
  acutest_check_((uint)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x26e,"%s","value_array_get_all(NULL) == NULL");
  pVVar5 = value_array_append((VALUE *)0x0);
  acutest_check_((uint)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x26f,"%s","value_array_append(NULL) == NULL");
  pVVar5 = value_array_insert((VALUE *)0x0,0);
  acutest_check_((uint)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x270,"%s","value_array_insert(NULL, 0) == NULL");
  pVVar5 = value_array_insert((VALUE *)0x0,0x7b);
  acutest_check_((uint)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x271,"%s","value_array_insert(NULL, 123) == NULL");
  iVar1 = value_array_remove((VALUE *)0x0,0);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x272,"%s","value_array_remove(NULL, 0) != 0");
  iVar1 = value_array_remove_range((VALUE *)0x0,0,0x7b);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x273,"%s","value_array_remove_range(NULL, 0, 123) != 0");
  value_array_clean((VALUE *)0x0);
  value_init_array(&local_40);
  VVar2 = value_type(&local_40);
  acutest_check_((uint)(VVar2 == VALUE_ARRAY),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x277,"%s","value_type(&a) == VALUE_ARRAY");
  iVar1 = value_is_compatible(&local_40,VALUE_NULL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x278,"%s","!value_is_compatible(&a, VALUE_NULL)");
  iVar1 = value_is_compatible(&local_40,VALUE_BOOL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x279,"%s","!value_is_compatible(&a, VALUE_BOOL)");
  iVar1 = value_is_compatible(&local_40,VALUE_INT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27a,"%s","!value_is_compatible(&a, VALUE_INT32)");
  iVar1 = value_is_compatible(&local_40,VALUE_UINT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27b,"%s","!value_is_compatible(&a, VALUE_UINT32)");
  iVar1 = value_is_compatible(&local_40,VALUE_INT64);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27c,"%s","!value_is_compatible(&a, VALUE_INT64)");
  iVar1 = value_is_compatible(&local_40,VALUE_UINT64);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27d,"%s","!value_is_compatible(&a, VALUE_UINT64)");
  iVar1 = value_is_compatible(&local_40,VALUE_FLOAT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27e,"%s","!value_is_compatible(&a, VALUE_FLOAT)");
  iVar1 = value_is_compatible(&local_40,VALUE_DOUBLE);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27f,"%s","!value_is_compatible(&a, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(&local_40,VALUE_ARRAY);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x280,"%s","value_is_compatible(&a, VALUE_ARRAY)");
  iVar1 = value_is_compatible(&local_40,VALUE_DICT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x281,"%s","!value_is_compatible(&a, VALUE_DICT)");
  sVar4 = value_array_size(&local_40);
  acutest_check_((uint)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x282,"%s","value_array_size(&a) == 0");
  pVVar5 = value_array_get(&local_40,0);
  acutest_check_((uint)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x283,"%s","value_array_get(&a, 0) == NULL");
  value_fini(&local_40);
  value_init_array(&local_40);
  pVVar5 = value_array_append(&local_40);
  acutest_check_((uint)(pVVar5 != (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x289,"%s","v != NULL");
  VVar2 = value_type(pVVar5);
  acutest_check_((uint)(VVar2 == VALUE_NULL),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x28a,"%s","value_type(v) == VALUE_NULL");
  iVar1 = value_is_new(pVVar5);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x28b,"%s","value_is_new(v)");
  value_init_null(pVVar5);
  pVVar5 = value_array_get(&local_40,0);
  iVar1 = value_is_new(pVVar5);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x28e,"%s","!value_is_new(v)");
  pVVar5 = value_array_get(&local_40,1);
  acutest_check_((uint)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x28f,"%s","value_array_get(&a, 1) == NULL");
  sVar4 = value_array_size(&local_40);
  acutest_check_((uint)(sVar4 == 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x290,"%s","value_array_size(&a) == 1");
  value_fini(&local_40);
  value_init_array(&local_40);
  pVVar5 = value_array_append(&local_40);
  value_init_int32(pVVar5,1);
  pVVar5 = value_array_append(&local_40);
  value_init_int32(pVVar5,2);
  pVVar5 = value_array_append(&local_40);
  value_init_int32(pVVar5,3);
  pVVar5 = value_array_insert(&local_40,0);
  value_init_int32(pVVar5,0);
  sVar4 = value_array_size(&local_40);
  acutest_check_((uint)(sVar4 == 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x29d,"%s","value_array_size(&a) == 4");
  pVVar5 = value_array_get(&local_40,0);
  uVar7 = 0;
  if (pVVar5 != (VALUE *)0x0) {
    iVar3 = value_int32(pVVar5);
    uVar7 = (uint)(iVar3 == 0);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x29f,"%s","v != NULL && value_int32(v) == 0");
  pVVar5 = value_array_get(&local_40,1);
  if (pVVar5 != (VALUE *)0x0) {
    iVar3 = value_int32(pVVar5);
    uVar6 = (uint)(iVar3 == 1);
  }
  uVar7 = 0;
  acutest_check_(uVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2a1,"%s","v != NULL && value_int32(v) == 1");
  pVVar5 = value_array_get(&local_40,2);
  uVar6 = 0;
  if (pVVar5 != (VALUE *)0x0) {
    iVar3 = value_int32(pVVar5);
    uVar6 = (uint)(iVar3 == 2);
  }
  acutest_check_(uVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2a3,"%s","v != NULL && value_int32(v) == 2");
  pVVar5 = value_array_get(&local_40,3);
  if (pVVar5 != (VALUE *)0x0) {
    iVar3 = value_int32(pVVar5);
    uVar7 = (uint)(iVar3 == 3);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2a5,"%s","v != NULL && value_int32(v) == 3");
  pVVar5 = value_array_get(&local_40,4);
  acutest_check_((uint)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2a7,"%s","v == NULL");
  value_array_clean(&local_40);
  sVar4 = value_array_size(&local_40);
  acutest_check_((uint)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2a9,"%s","value_array_size(&a) == 0");
  value_fini(&local_40);
  return;
}

Assistant:

static void
test_array_basic(void)
{
    VALUE a;
    VALUE* v;

    TEST_CHECK(value_init_array(NULL) != 0);
    TEST_CHECK(value_array_size(NULL) == 0);
    TEST_CHECK(value_array_get(NULL, 0) == NULL);
    TEST_CHECK(value_array_get_all(NULL) == NULL);
    TEST_CHECK(value_array_append(NULL) == NULL);
    TEST_CHECK(value_array_insert(NULL, 0) == NULL);
    TEST_CHECK(value_array_insert(NULL, 123) == NULL);
    TEST_CHECK(value_array_remove(NULL, 0) != 0);
    TEST_CHECK(value_array_remove_range(NULL, 0, 123) != 0);
    value_array_clean(NULL);

    value_init_array(&a);
    TEST_CHECK(value_type(&a) == VALUE_ARRAY);
    TEST_CHECK(!value_is_compatible(&a, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&a, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&a, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&a, VALUE_UINT32));
    TEST_CHECK(!value_is_compatible(&a, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&a, VALUE_UINT64));
    TEST_CHECK(!value_is_compatible(&a, VALUE_FLOAT));
    TEST_CHECK(!value_is_compatible(&a, VALUE_DOUBLE));
    TEST_CHECK(value_is_compatible(&a, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&a, VALUE_DICT));
    TEST_CHECK(value_array_size(&a) == 0);
    TEST_CHECK(value_array_get(&a, 0) == NULL);
    value_fini(&a);

    /* Check basic new value properties. */
    value_init_array(&a);
    v = value_array_append(&a);
    TEST_CHECK(v != NULL);
    TEST_CHECK(value_type(v) == VALUE_NULL);
    TEST_CHECK(value_is_new(v));
    value_init_null(v);
    v = value_array_get(&a, 0);
    TEST_CHECK(!value_is_new(v));
    TEST_CHECK(value_array_get(&a, 1) == NULL);
    TEST_CHECK(value_array_size(&a) == 1);
    value_fini(&a);

    /* Simple append/insert test. */
    value_init_array(&a);
    v = value_array_append(&a);
    value_init_int32(v, 1);
    v = value_array_append(&a);
    value_init_int32(v, 2);
    v = value_array_append(&a);
    value_init_int32(v, 3);
    v = value_array_insert(&a, 0);
    value_init_int32(v, 0);
    TEST_CHECK(value_array_size(&a) == 4);
    v = value_array_get(&a, 0);
    TEST_CHECK(v != NULL && value_int32(v) == 0);
    v = value_array_get(&a, 1);
    TEST_CHECK(v != NULL && value_int32(v) == 1);
    v = value_array_get(&a, 2);
    TEST_CHECK(v != NULL && value_int32(v) == 2);
    v = value_array_get(&a, 3);
    TEST_CHECK(v != NULL && value_int32(v) == 3);
    v = value_array_get(&a, 4);
    TEST_CHECK(v == NULL);
    value_array_clean(&a);
    TEST_CHECK(value_array_size(&a) == 0);
    value_fini(&a);
}